

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O2

void __thiscall KVStore::put(KVStore *this,uint64_t key,string *value)

{
  SkipList *this_00;
  string *__lhs;
  int __val;
  bool bVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  SSTableCache *this_01;
  uint64_t uVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileName;
  undefined1 local_f8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->memTable;
  uVar2 = SkipList::getLength(this_00);
  uVar3 = SkipList::getValueSize(this_00);
  uVar4 = value->_M_string_length;
  if (0x1fffff < uVar4 + uVar2 * 0xc + uVar3 + 0x2838) {
    __lhs = &this->storagePath;
    local_f8._32_8_ = key;
    std::operator+(&local_50,__lhs,"/level-0");
    bVar1 = utils::dirExists(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar1) {
      psVar5 = __lhs;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     __lhs,"/level-0");
      utils::mkdir((char *)local_f8._0_8_,(__mode_t)psVar5);
      std::__cxx11::string::~string((string *)local_f8);
    }
    std::operator+(&local_70,__lhs,"/level-0/");
    __val = this->fileNums;
    this->fileNums = __val + 1;
    std::__cxx11::to_string(&local_90,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f8 + 0x28),&local_70,&local_90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f8 + 0x28),".sst");
    std::__cxx11::string::~string((string *)(local_f8 + 0x28));
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    SSTable::toSSTable((SSTable *)this_00,(SkipList *)local_f8,(string *)this->timeStamp,uVar4);
    this_01 = (SSTableCache *)operator_new(0x2858);
    uVar4 = this->timeStamp;
    std::__cxx11::string::string((string *)&local_b0,(string *)local_f8);
    SSTableCache::SSTableCache(this_01,this_00,uVar4,&local_b0);
    local_d0._M_dataplus._M_p = (pointer)this_01;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
    ::_M_emplace_unique<std::__cxx11::string&,SSTableCache*>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
                *)&this->cache,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               (SSTableCache **)(local_f8 + 0x28));
    std::__cxx11::string::~string((string *)&local_b0);
    this->timeStamp = this->timeStamp + 1;
    SkipList::reset(this_00);
    key = local_f8._32_8_;
    compaction(this,0);
    std::__cxx11::string::~string((string *)local_f8);
  }
  SkipList::put(this_00,key,value);
  return;
}

Assistant:

void KVStore::put(uint64_t key, const string &value) {
  // if overflow, convert memTable to a SSTable and do compaction
  if (overflow(memTable.getLength() + 1,
               memTable.getValueSize() + value.size())) {
    if (!utils::dirExists(storagePath + "/level-0"))
      utils::mkdir((storagePath + "/level-0").c_str());

    auto fileName = storagePath + "/level-0/" + to_string(fileNums++) + ".sst";
    SSTable::toSSTable(memTable, fileName, timeStamp);
    cache.emplace(fileName, new SSTableCache(memTable, timeStamp, fileName));
    timeStamp++;

    memTable.reset();

    compaction(0);
  }
  memTable.put(key, value);
}